

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O3

HTABLE_NODE *
htable_remove(HTABLE *htable,HTABLE_NODE *key,HTABLE_CMP_FUNC cmp_func,HTABLE_HASH_FUNC hash_func)

{
  int iVar1;
  HTABLE_NODE *pHVar2;
  void *pvVar3;
  void *__ptr;
  bool bVar4;
  uint32_t uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  HTABLE_NODE *pHVar9;
  int iVar10;
  long *plVar11;
  long *plVar12;
  long lVar13;
  
  uVar5 = (*hash_func)(key);
  lVar13 = (long)htable->n_planes;
  if (0 < lVar13) {
    do {
      pHVar2 = (HTABLE_NODE *)
               (((ulong)uVar5 % (ulong)(uint)(0x3b << ((byte)(lVar13 + -1) & 0x1f))) * 8 +
               (long)htable->planes[lVar13 + -1]);
      while (pHVar9 = pHVar2, pHVar2 = pHVar9->next, pHVar2 != (HTABLE_NODE *)0x0) {
        iVar6 = (*cmp_func)(key,pHVar2);
        if (iVar6 == 0) {
          pHVar9->next = pHVar2->next;
          uVar7 = htable->n - 1;
          htable->n = uVar7;
          iVar1 = htable->n_planes;
          iVar10 = 0x3b << ((byte)iVar1 & 0x1f);
          iVar6 = iVar10 + -0x3b;
          iVar10 = iVar10 + -0x38;
          if (-1 < iVar6) {
            iVar10 = iVar6;
          }
          if ((ulong)(long)(iVar10 >> 2) <= uVar7) {
            return pHVar2;
          }
          if (uVar7 == 0) {
            htable_free_all_planes(htable);
            return pHVar2;
          }
          if (iVar1 < 2) {
            return pHVar2;
          }
          pvVar3 = htable->planes[iVar1 - 2U];
          __ptr = htable->planes[iVar1 - 1U];
          uVar7 = 0;
          do {
            plVar12 = *(long **)((long)__ptr + uVar7 * 8);
            if (plVar12 != (long *)0x0) {
              uVar8 = uVar7 % (ulong)(long)(0x3b << ((byte)(iVar1 - 2U) & 0x1f));
              lVar13 = *(long *)((long)pvVar3 + uVar8 * 8);
              if (lVar13 != 0) {
                do {
                  plVar11 = plVar12;
                  plVar12 = (long *)*plVar11;
                } while (plVar12 != (long *)0x0);
                *plVar11 = lVar13;
                plVar12 = *(long **)((long)__ptr + uVar7 * 8);
              }
              *(long **)((long)pvVar3 + uVar8 * 8) = plVar12;
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != (long)(0x3b << ((byte)(iVar1 - 1U) & 0x1f)));
          free(__ptr);
          htable->n_planes = htable->n_planes + -1;
          return pHVar2;
        }
      }
      bVar4 = 1 < lVar13;
      lVar13 = lVar13 + -1;
    } while (bVar4);
  }
  return (HTABLE_NODE *)0x0;
}

Assistant:

HTABLE_NODE*
htable_remove(HTABLE* htable, const HTABLE_NODE* key,
              HTABLE_CMP_FUNC cmp_func, HTABLE_HASH_FUNC hash_func)
{
    uint32_t hash;
    HTABLE_NODE* node;
    HTABLE_NODE** p_ref;

    hash = hash_func(key);
    node = htable_lookup_internal(htable, hash, key, &p_ref, cmp_func);
    if(node == NULL)
        return NULL;

    *p_ref = node->next;
    htable->n--;

    if(HTABLE_TOO_EMPTY(htable))
        htable_shrink(htable);

    return node;
}